

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::Coap::FinalizeTransaction
          (Coap *this,RequestHolder *aRequestHolder,Response *aResponse,Error *aResult)

{
  ResponseHandler *__x;
  _Manager_type *pp_Var1;
  _Manager_type p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  ResponseHandler handler;
  Response *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  if ((aRequestHolder->mHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
    __x = &aRequestHolder->mHandler;
    pp_Var1 = &(aRequestHolder->mHandler).super__Function_base._M_manager;
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              ((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               &local_78,__x);
    p_Var2 = *pp_Var1;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
      *pp_Var1 = (_Manager_type)0x0;
      (aRequestHolder->mHandler)._M_invoker = (_Invoker_type)0x0;
    }
    local_58._0_4_ = aResult->mCode;
    pcVar3 = (aResult->mMessage)._M_dataplus._M_p;
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + (aResult->mMessage)._M_string_length);
    local_80 = aResponse;
    if (local_68 == (code *)0x0) {
      uVar4 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar4);
    }
    (*local_60)(&local_78,&local_80,(Error *)local_58);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  RequestsCache::Eliminate(&this->mRequestsCache,aRequestHolder);
  return;
}

Assistant:

void Coap::FinalizeTransaction(const RequestHolder &aRequestHolder, const Response *aResponse, Error aResult)
{
    if (aRequestHolder.mHandler != nullptr)
    {
        auto handler = aRequestHolder.mHandler;

        // The user-provided handler may do anything that causing this
        // handler be recursively called (For example, user stops the CoAP
        // instance which will finalize all transactions). Set this handler
        // to null to stop a handler being recalled.
        aRequestHolder.mHandler = nullptr;
        handler(aResponse, aResult);
    }
    mRequestsCache.Eliminate(aRequestHolder);
}